

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  _Function_base *p_Var2;
  __native_type *p_Var3;
  undefined1 uVar4;
  undefined2 minLen;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *plVar5;
  string most_common_only;
  ulong *puVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  mutex *pmVar10;
  Argument *pAVar11;
  reference pvVar12;
  int *piVar13;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this;
  void *__dest;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *plVar14;
  ostream *poVar15;
  size_t sVar16;
  reference_wrapper<std::mutex_*> rVar17;
  _List_node_base *p_Var18;
  reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar19;
  size_t __n;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  undefined1 auVar22 [8];
  _Elt_pointer pfVar23;
  ulong uVar24;
  undefined8 uVar25;
  ulong *puVar26;
  char *pcVar27;
  long *in_FS_OFFSET;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  json config;
  int codewordLen;
  string inp;
  string configPath;
  BitInStream bin;
  unordered_map<string,_vector<string>_> motif;
  unsigned_short ret;
  int ret_2;
  unordered_set<string> codewords;
  ofstream out;
  unordered_map<string,_int32_t> freqDict;
  ofstream confout;
  FreqTable freqs;
  ArgumentParser program;
  ProbMap propMap;
  unordered_map<string,_char2double> pMap;
  stringstream buffer;
  undefined1 local_1050 [24];
  undefined1 local_1038 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  any local_ff8;
  any local_fe8;
  undefined1 local_fd8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_fd0;
  undefined1 local_fc8 [48];
  pointer local_f98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f70;
  string local_f60;
  string local_f40;
  string local_f20;
  long *local_f00 [2];
  long local_ef0 [2];
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_e60;
  _Any_data local_e48;
  code *local_e38;
  _Any_data local_e28;
  code *local_e18;
  unordered_map<string,_vector<string>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  undefined1 local_d80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d70;
  int aiStack_d60 [8];
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d40;
  pointer local_cc8;
  pointer local_cc0;
  undefined1 local_b20 [16];
  string local_b10;
  _Head_base<2UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_af0;
  _Head_base<1UL,_std::reference_wrapper<FreqTable>,_false> local_ae8;
  _Head_base<0UL,_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_ae0;
  unordered_set<std::string> local_918;
  undefined1 local_8e0 [8];
  reference_wrapper<std::mutex_*> local_8d8;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *local_8d0 [2];
  _Head_base<4UL,_std::reference_wrapper<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
  local_8c0;
  _Head_base<3UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_8b8;
  _Head_base<2UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_8b0;
  _Head_base<1UL,_std::reference_wrapper<FreqTable>,_false> local_8a8;
  _Head_base<0UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_8a0;
  ios_base local_7e8 [264];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  string2int32 local_6c0;
  undefined1 local_688 [8];
  __native_type *local_680;
  __native_type local_678 [2];
  ios_base local_608 [120];
  ios_base local_590 [264];
  FreqTable local_488;
  ArgumentParser local_370;
  ProbMap local_288;
  unordered_map<string,_char2double> local_200;
  unordered_map<string,_char2double> local_1b8;
  ios_base local_138 [264];
  
  pmVar10 = (mutex *)operator_new(0x28);
  (pmVar10->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  res_lock = pmVar10;
  (pmVar10->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pmVar10->super___mutex_base)._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pmVar10->super___mutex_base)._M_mutex + 0x10) = 0;
  (pmVar10->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,"arithmetic_error_correction","");
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"1.0.0","");
  sVar16 = 3;
  argparse::ArgumentParser::ArgumentParser(&local_370,&local_ec0,&local_ee0,all);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
    operator_delete(local_ec0._M_dataplus._M_p,local_ec0.field_2._M_allocated_capacity + 1);
  }
  pAVar11 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                      (&local_370,"-e","--encode");
  local_d80._0_8_ = local_d80._0_8_ & 0xffffffffffffff00;
  pAVar11 = argparse::Argument::default_value<bool>(pAVar11,(bool *)local_d80);
  local_fe8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_fe8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar11->mImplicitValue,&local_fe8);
  pAVar11->mNumArgs = 0;
  local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da0,"encode a file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar11->mHelp,&local_da0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p != &local_da0.field_2) {
    operator_delete(local_da0._M_dataplus._M_p,local_da0.field_2._M_allocated_capacity + 1);
  }
  if ((mz_file_read_func)local_fe8._M_manager != (mz_file_read_func)0x0) {
    (*local_fe8._M_manager)((void *)0x3,(mz_uint64)&local_fe8,(void *)0x0,sVar16);
    local_fe8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar11 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                      (&local_370,"-d","--decode");
  local_d80._0_8_ = local_d80._0_8_ & 0xffffffffffffff00;
  pAVar11 = argparse::Argument::default_value<bool>(pAVar11,(bool *)local_d80);
  local_ff8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_ff8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar11->mImplicitValue,&local_ff8);
  pAVar11->mNumArgs = 0;
  local_dc0._M_dataplus._M_p = (pointer)&local_dc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc0,"decode a file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar11->mHelp,&local_dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc0._M_dataplus._M_p != &local_dc0.field_2) {
    operator_delete(local_dc0._M_dataplus._M_p,local_dc0.field_2._M_allocated_capacity + 1);
  }
  if ((mz_realloc_func)local_ff8._M_manager != (mz_realloc_func)0x0) {
    (*local_ff8._M_manager)((void *)0x3,&local_ff8,0,sVar16);
    local_ff8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar11 = argparse::ArgumentParser::add_argument<char_const*>(&local_370,"Config");
  pAVar11->field_0xcc = pAVar11->field_0xcc | 2;
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,"config file with program parameters","");
  main_cold_1();
  argparse::ArgumentParser::parse_args(&local_370,argc,argv);
  aArgumentName._M_str = "--encode";
  aArgumentName._M_len = 8;
  bVar7 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName);
  aArgumentName_00._M_str = "--decode";
  aArgumentName_00._M_len = 8;
  bVar8 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName_00);
  if ((bVar7 == bVar8) ||
     (aArgumentName_01._M_str = "-h", aArgumentName_01._M_len = 2,
     bVar8 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName_01), bVar8)) {
    poVar15 = argparse::operator<<((ostream *)&std::cerr,&local_370);
    std::endl<char,std::char_traits<char>>(poVar15);
    exit(1);
  }
  aArgumentName_02._M_str = "Config";
  aArgumentName_02._M_len = 6;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_1018,&local_370,aArgumentName_02);
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f00,local_1018._M_dataplus._M_p,
             local_1018._M_dataplus._M_p + local_1018._M_string_length);
  parseValidateConfig((string *)local_1050,false);
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0],local_ef0[0] + 1);
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_1050,"general");
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar12,"codebook");
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar12,"words");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_d80,pvVar12);
  parseFasta(&local_918,(string *)local_d80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d80._0_8_ != &local_d70) {
    operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
  }
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_1050,"general");
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar12,"codebook");
  pvVar12 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar12,"motifs");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_d80,pvVar12);
  readConcScheme(&local_e08,(string *)local_d80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d80._0_8_ != &local_d70) {
    operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
  }
  local_1050._20_4_ = getCodewordLen(&local_918);
  ProbMap::ProbMap(&local_288,local_1050._20_4_,false,&local_918,&local_e08);
  ProbMap::freqDict_abi_cxx11_(&local_6c0,&local_288);
  ProbMap::createTransitionDict(&local_200,&local_288,&local_6c0);
  local_d70._M_allocated_capacity = 0;
  local_d80._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d80;
  local_d80._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d80;
  std::__cxx11::
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::_M_move_assign(&results_abi_cxx11_,
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_d80);
  std::__cxx11::
  _List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::_M_clear((_List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_d80);
  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"");
  FreqTable::FreqTable(&local_488,&local_e08,&local_f20,0,false,local_1050._20_4_,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
  }
  FreqTable::calcFreqs(&local_488);
  if (bVar7) {
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_1050,"encode");
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar12,"input");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_d80,pvVar12);
    local_b20._0_8_ = local_d80._8_8_;
    local_b20._8_8_ = local_d80._0_8_;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_b20,".zip");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d80._0_8_ != &local_d70) {
      operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
    }
    if (bVar7) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_f70,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_1050);
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"min_length");
      local_d80._0_8_ = local_d80._0_8_ & 0xffffffffffff0000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
                (pvVar12,(unsigned_short *)local_d80);
      minLen = local_d80._0_2_;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"same_length");
      local_d80._0_8_ = local_d80._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar12,(boolean_t *)local_d80);
      uVar4 = local_d80[0];
      local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f40,local_1018._M_dataplus._M_p,
                 local_1018._M_dataplus._M_p + local_1018._M_string_length);
      encode_zip(&local_f70,&local_488,minLen,(bool)uVar4,&local_f40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_f70);
    }
    else {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"input");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar12);
      std::ifstream::ifstream(local_d80,(string *)local_b20,_S_bin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      if (*(int *)((long)aiStack_d60 + *(size_type *)(local_d80._0_8_ - 0x18)) != 0) {
        __assert_fail("inStream.good()",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/main.cpp"
                      ,0xac,"int main(int, char **)");
      }
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"sync");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar12,(int *)local_b20);
      BitInStream::BitInStream((BitInStream *)local_fd8,(istream *)local_d80,local_b20._0_4_);
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"output");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar12);
      std::ofstream::ofstream(local_8e0,(string *)local_b20,_S_bin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"min_length");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar12,(int *)local_b20);
      inflating<std::ofstream>
                (&local_488,(BitInStream *)local_fd8,
                 (basic_ofstream<char,_std::char_traits<char>_> *)local_8e0,local_b20._0_4_);
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"update_config");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar12,(boolean_t *)local_b20);
      local_8e0 = (undefined1  [8])_VTT;
      uVar25 = _strtod;
      if (local_b20[0] != (string)0x0) {
        std::ostream::flush();
        std::ofstream::close();
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"encode");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_688,pvVar12);
        std::ifstream::ifstream(local_b20,(string *)local_688,_S_in);
        if (local_688 != (undefined1  [8])local_678) {
          operator_delete((void *)local_688,(ulong)(local_678[0].__align + 1));
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::ostream::operator<<(&local_1b8.mHashMultiplier,(streambuf *)&local_b10);
        std::__cxx11::stringbuf::str();
        local_f80.m_type = null;
        local_f80.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)5>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_f80,(long)(int)local_1038._8_4_);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_f80,true);
        local_688 = (undefined1  [8])local_678;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"/decode/length","");
        nlohmann::
        json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::split(&local_e60.reference_tokens,(string *)local_688);
        this = nlohmann::
               json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::get_unchecked(&local_e60,
                               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_1050);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(this,&local_f80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e60.reference_tokens);
        if (local_688 != (undefined1  [8])local_678) {
          operator_delete((void *)local_688,(ulong)(local_678[0].__align + 1));
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_f80);
        std::ofstream::ofstream(local_688,(string *)&local_1018,_S_out);
        nlohmann::operator<<
                  ((ostream *)local_688,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_1050);
        uVar25 = _strtod;
        p_Var3 = _VTT;
        local_688 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_688 + *(long *)&_VTT[-1].__data.__kind) = _strtod;
        std::filebuf::~filebuf((filebuf *)&local_680);
        std::ios_base::~ios_base(local_590);
        if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
        std::ifstream::~ifstream(local_b20);
        local_8e0 = (undefined1  [8])p_Var3;
      }
      *(undefined8 *)
       (local_8e0 + *(long *)&(((__native_type *)((long)local_8e0 + -0x28))->__data).__kind) =
           uVar25;
      std::filebuf::~filebuf((filebuf *)&local_8d8);
      std::ios_base::~ios_base(local_7e8);
      if ((void *)local_fc8._32_8_ != (void *)0x0) {
        operator_delete((void *)local_fc8._32_8_,(long)local_f98 - local_fc8._32_8_);
      }
      if ((pointer)local_fc8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_fc8._8_8_,local_fc8._24_8_ - local_fc8._8_8_);
      }
      std::ifstream::~ifstream(local_d80);
    }
  }
  else {
    ProbMap::ProbMap((ProbMap *)local_d80,local_1050._20_4_,true,&local_918,&local_e08);
    ProbMap::createTransitionDict(&local_1b8,(ProbMap *)local_d80,&local_6c0);
    robin_hood::detail::
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Table(&local_d40);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_d80 + 8));
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_1050,"decode");
    pvVar12 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar12,"input");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_d80,pvVar12);
    local_b20._0_8_ = local_d80._8_8_;
    local_b20._8_8_ = local_d80._0_8_;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_b20,".zip");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d80._0_8_ != &local_d70) {
      operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
    }
    if (bVar7) {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"decode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"input");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar12);
      Zippy::ZipArchive::ZipArchive((ZipArchive *)local_d80,(string *)local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      Zippy::ZipArchive::GetEntryNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_688,(ZipArchive *)local_d80,true,true);
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"threads");
      local_8e0 = (undefined1  [8])((ulong)(uint)local_8e0._4_4_ << 0x20);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar12,(int *)local_8e0);
      absl::synchronization_internal::ThreadPool::ThreadPool
                ((ThreadPool *)local_b20,local_8e0._0_4_);
      p_Var3 = local_680;
      local_fc8._0_8_ = (mz_zip_internal_state *)0x0;
      local_fd8 = (undefined1  [8])0x0;
      pbStack_fd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_688 != (undefined1  [8])local_680) {
        auVar22 = local_688;
        do {
          Zippy::ZipArchive::GetEntry((ZipArchive *)local_1038,(string *)local_d80);
          Zippy::Impl::ZipEntry::GetDataAsString_abi_cxx11_
                    ((string *)local_8e0,(ZipEntry *)CONCAT44(local_1038._12_4_,local_1038._8_4_));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_fd8,
                     (string *)local_8e0);
          if (local_8e0 != (undefined1  [8])local_8d0) {
            operator_delete((void *)local_8e0,(ulong)((long)local_8d0[0] + 1));
          }
          pbVar21 = pbStack_fd0;
          auVar22 = (undefined1  [8])((long)auVar22 + 0x20);
        } while (auVar22 != (undefined1  [8])p_Var3);
        if (local_fd8 != (undefined1  [8])pbStack_fd0) {
          rVar19._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fd8;
          auVar22 = local_fd8;
          do {
            local_8e0 = (undefined1  [8])do_decode;
            local_8d8._M_data = &res_lock;
            local_8d0[1] = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)(local_1050 + 0x14);
            local_8d0[0] = &results_abi_cxx11_;
            local_8c0._M_head_impl._M_data =
                 (reference_wrapper<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )local_1050;
            local_8b8._M_head_impl._M_data =
                 (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&local_e08;
            local_8b0._M_head_impl._M_data =
                 (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&local_1b8;
            local_8a8._M_head_impl._M_data = (reference_wrapper<FreqTable>)&local_488;
            local_8a0._M_head_impl._M_data =
                 (reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )rVar19._M_data;
            std::function<void()>::
            function<std::_Bind<void(*(std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<FreqTable>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::reference_wrapper<int>,std::reference_wrapper<std::__cxx11::list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tupl___td::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,std::mutex*)>,void>
                      ((function<void()> *)local_e28._M_pod_data,(_Bind<_19e92c60_> *)local_8e0);
            absl::synchronization_internal::ThreadPool::Schedule
                      ((ThreadPool *)local_b20,(function<void_()> *)&local_e28);
            if (local_e18 != (code *)0x0) {
              (*local_e18)(&local_e28,&local_e28,__destroy_functor);
            }
            auVar22 = (undefined1  [8])((long)auVar22 + 0x20);
            rVar19._M_data = rVar19._M_data + 1;
          } while (auVar22 != (undefined1  [8])pbVar21);
        }
      }
      if (results_abi_cxx11_.
          super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl._M_node._M_size != (long)local_680 - (long)local_688 >> 5) {
        do {
          local_8e0 = (undefined1  [8])0x0;
          local_8d8._M_data = (mutex **)0x1dcd6500;
          do {
            iVar9 = nanosleep((timespec *)local_8e0,(timespec *)local_8e0);
            if (iVar9 != -1) break;
            piVar13 = __errno_location();
          } while (*piVar13 == 4);
        } while (results_abi_cxx11_.
                 super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ._M_impl._M_node._M_size != (long)local_680 - (long)local_688 >> 5);
      }
      local_8e0 = (undefined1  [8])res_lock;
      local_8d8._M_data = local_8d8._M_data & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_8e0);
      local_8d8._M_data._0_1_ = 1;
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"decode");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"output");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_e80,pvVar12);
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"zip");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"most_common_only");
      local_1038._0_8_ = local_1038._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar12,(boolean_t *)local_1038);
      uVar4 = local_1038[0];
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"zip");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"decodable_only");
      local_1038._0_8_ = local_1038._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar12,(boolean_t *)local_1038);
      write_to_zip(&local_e80,true,(bool)uVar4,(bool)local_1038[0],&results_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
        operator_delete(local_e80._M_dataplus._M_p,local_e80.field_2._M_allocated_capacity + 1);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_8e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_fd8);
      absl::synchronization_internal::ThreadPool::~ThreadPool((ThreadPool *)local_b20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_688);
      Zippy::ZipArchive::~ZipArchive((ZipArchive *)local_d80);
    }
    else {
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar12 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar12,"as_fasta");
      local_d80._0_8_ = local_d80._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar12,(boolean_t *)local_d80);
      if ((bool)local_d80[0] == true) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"input");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_d80,pvVar12);
        parseFasta((unordered_set<std::string> *)local_8e0,(string *)local_d80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d80._0_8_ != &local_d70) {
          operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
        }
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"threads");
        local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                  (pvVar12,(int *)local_b20);
        absl::synchronization_internal::ThreadPool::ThreadPool
                  ((ThreadPool *)local_d80,local_b20._0_4_);
        plVar5 = local_8d0[0];
        if (local_8d0[1] ==
            (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)0x0) {
          plVar14 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)(undefined1 *)0x0;
        }
        else {
          p_Var18 = *(_List_node_base **)local_8d0[0];
          rVar17._M_data = local_8d8._M_data;
          pfVar23 = (_Elt_pointer)local_8d0[0];
          while (p_Var18 == (_List_node_base *)0x0) {
            p_Var2 = &pfVar23->super__Function_base;
            rVar17._M_data = rVar17._M_data + 0x20;
            pfVar23 = (_Elt_pointer)((long)&(pfVar23->super__Function_base)._M_functor + 8);
            p_Var18 = *(_List_node_base **)((long)&p_Var2->_M_functor + 8);
          }
          uVar1 = 0;
          for (; ((ulong)p_Var18 & 1) == 0;
              p_Var18 = (_List_node_base *)((ulong)p_Var18 >> 1 | 0x8000000000000000)) {
            uVar1 = uVar1 + 1;
          }
          rVar20._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)rVar17._M_data + (ulong)((uVar1 >> 3) << 5));
          plVar14 = local_8d0[1];
          if (rVar20._M_data !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0[0]) {
            pcVar27 = (pfVar23->super__Function_base)._M_functor._M_pod_data + (uVar1 >> 3);
            do {
              local_b20._0_8_ = do_decode;
              local_b20._8_8_ = &res_lock;
              local_b10._M_string_length = (size_type)(local_1050 + 0x14);
              local_b10._M_dataplus._M_p = (pointer)&results_abi_cxx11_;
              local_b10.field_2._M_allocated_capacity = (size_type)local_1050;
              local_b10.field_2._8_8_ = &local_e08;
              local_af0._M_head_impl._M_data =
                   (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )&local_1b8;
              local_ae8._M_head_impl._M_data = (reference_wrapper<FreqTable>)&local_488;
              local_ae0._M_head_impl._M_data =
                   (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )rVar20._M_data;
              std::function<void()>::
              function<std::_Bind<void(*(std::reference_wrapper<std::__cxx11::string_const>,std::reference_wrapper<FreqTable>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::reference_wrapper<int>,std::reference_wrapper<std::__cxx11::list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std___td::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,std::mutex*)>,void>
                        ((function<void()> *)local_e48._M_pod_data,(_Bind<_195e0cfd_> *)local_b20);
              absl::synchronization_internal::ThreadPool::Schedule
                        ((ThreadPool *)local_d80,(function<void_()> *)&local_e48);
              if (local_e38 != (code *)0x0) {
                (*local_e38)(&local_e48,&local_e48,__destroy_functor);
              }
              uVar24 = *(ulong *)(pcVar27 + 1);
              pbVar21 = rVar20._M_data + 1;
              if (uVar24 == 0) {
                puVar6 = (ulong *)(pcVar27 + 9);
                do {
                  puVar26 = puVar6;
                  uVar24 = *puVar26;
                  pbVar21 = pbVar21 + 8;
                  puVar6 = puVar26 + 1;
                } while (uVar24 == 0);
              }
              else {
                puVar26 = (ulong *)(pcVar27 + 1);
              }
              uVar1 = 0;
              for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                uVar1 = uVar1 + 1;
              }
              pcVar27 = (char *)((long)puVar26 + (ulong)(uVar1 >> 3));
              rVar20._M_data =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((((_Function_base *)&pbVar21->_M_dataplus)->_M_functor)._M_pod_data +
                   ((uVar1 >> 3) << 5));
              plVar14 = local_8d0[1];
            } while (rVar20._M_data !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar5);
          }
        }
        if (results_abi_cxx11_.
            super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ._M_impl._M_node._M_size < plVar14) {
          do {
            local_b20._0_8_ = (pointer)0x1;
            local_b20._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            do {
              iVar9 = nanosleep((timespec *)local_b20,(timespec *)local_b20);
              if (iVar9 != -1) break;
              piVar13 = __errno_location();
            } while (*piVar13 == 4);
          } while (results_abi_cxx11_.
                   super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl._M_node._M_size < local_8d0[1]);
        }
        local_b20._0_8_ = res_lock;
        local_b20._8_8_ = local_b20._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b20);
        local_b20[8] = 1;
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_ea0,pvVar12);
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"zip");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"most_common_only");
        local_688 = (undefined1  [8])((ulong)local_688 & 0xffffffffffffff00);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar12,(boolean_t *)local_688);
        most_common_only = local_688[0];
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"zip");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"decodable_only");
        local_688 = (undefined1  [8])((ulong)local_688 & 0xffffffffffffff00);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar12,(boolean_t *)local_688);
        write_to_zip(&local_ea0,true,(bool)most_common_only,(bool)local_688[0],&results_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
          operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b20);
        absl::synchronization_internal::ThreadPool::~ThreadPool((ThreadPool *)local_d80);
        robin_hood::detail::
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_8e0);
      }
      else {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"input");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_d80,pvVar12);
        std::ifstream::ifstream(local_b20,(string *)local_d80,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d80._0_8_ != &local_d70) {
          operator_delete((void *)local_d80._0_8_,local_d70._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_688);
        std::ostream::operator<<(local_678,(streambuf *)&local_b10);
        std::__cxx11::stringbuf::str();
        if ((char)in_FS_OFFSET[-2] == '\0') {
          local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f60,local_fd8,
                     (code *)((long)&(pbStack_fd0->_M_dataplus)._M_p +
                             (long)&((_Alloc_hider *)local_fd8)->_M_p));
          ECdecoding::ECdecoding
                    ((ECdecoding *)(*in_FS_OFFSET + -0x238),&local_f60,&local_488,&local_1b8,true,
                     (json *)local_1050);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
            operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
          }
          __cxa_thread_atexit(ECdecoding::~ECdecoding,*in_FS_OFFSET + -0x238,&__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -2) = 1;
        }
        ECdecoding::decode((SeqEntry *)local_d80,(ECdecoding *)(*in_FS_OFFSET + -0x238),
                           local_1050._20_4_,&local_e08,(json *)local_1050);
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_1038,pvVar12);
        std::ofstream::ofstream(local_8e0,(string *)local_1038,_S_out|_S_bin);
        pcVar27 = local_1038 + 0x10;
        if ((char *)local_1038._0_8_ != pcVar27) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        uVar24 = (long)local_cc0 - (long)local_cc8;
        if (uVar24 == 0) {
          __dest = (void *)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar24 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = operator_new(uVar24);
          __n = (long)local_cc0 - (long)local_cc8;
        }
        if (local_cc0 != local_cc8) {
          memmove(__dest,local_cc8,__n);
        }
        local_1038._0_8_ = pcVar27;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1038,__dest,__n + (long)__dest);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8e0,(char *)local_1038._0_8_,
                   CONCAT44(local_1038._12_4_,local_1038._8_4_));
        std::ostream::flush();
        std::ofstream::close();
        if ((char *)local_1038._0_8_ != pcVar27) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        if (__dest != (void *)0x0) {
          operator_delete(__dest,uVar24);
        }
        local_8e0 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_8e0 + *(long *)&_VTT[-1].__data.__kind) = _strtod;
        std::filebuf::~filebuf((filebuf *)&local_8d8);
        std::ios_base::~ios_base(local_7e8);
        SeqEntry::~SeqEntry((SeqEntry *)local_d80);
        if (local_fd8 != (undefined1  [8])local_fc8) {
          operator_delete((void *)local_fd8,(ulong)(local_fc8._0_8_ + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_688);
        std::ios_base::~ios_base(local_608);
        std::ifstream::~ifstream(local_b20);
      }
    }
    robin_hood::detail::
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Table(&local_1b8);
  }
  if (local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.super_ProbabilityEval.seq._M_dataplus._M_p !=
      &local_488.super_ProbabilityEval.seq.field_2) {
    operator_delete(local_488.super_ProbabilityEval.seq._M_dataplus._M_p,
                    local_488.super_ProbabilityEval.seq.field_2._M_allocated_capacity + 1);
  }
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_488.super_ProbabilityEval.motif);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_488.super_ProbabilityEval.updatedDict);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_200);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_6c0);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_288.motif);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_288.codewords);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_e08);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_918);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_1050);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
  }
  argparse::ArgumentParser::~ArgumentParser(&local_370);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    res_lock = new std::mutex();
    argparse::ArgumentParser program("arithmetic_error_correction", "1.0.0");
    program.add_argument("-e", "--encode").default_value(false).implicit_value(true).help("encode a file");
    program.add_argument("-d", "--decode").default_value(false).implicit_value(true).help("decode a file");
    program.add_argument("Config").required().help("config file with program parameters");
    try {
        program.parse_args(argc, argv);
    }
    catch (const runtime_error &err) {
        cerr << err.what() << endl;
        cerr << program << endl;
        exit(EXIT_FAILURE);
    }
    // ensure only en- OR decoding is selected
    bool encode = program.get<bool>("--encode");
    bool decode = program.get<bool>("--decode");
    if (!(encode ^ decode) || program.get<bool>("-h")) {
        cerr << program << endl;
        exit(EXIT_FAILURE);
    }

    string configPath = program.get<string>("Config");
    nlohmann::json config = parseValidateConfig(configPath, encode);
    
    robin_hood::unordered_set<string> codewords = parseFasta(config["general"]["codebook"]["words"]); //hp4_gc40-60.fasta
    robin_hood::unordered_map<string, vector<string>> motif = readConcScheme(config["general"]["codebook"]["motifs"]); //hp4_gc40-60.json"
    
    int codewordLen = getCodewordLen(codewords);
    auto propMap = ProbMap(codewordLen, false, codewords, motif);
    robin_hood::unordered_map<string, int32_t> freqDict = propMap.freqDict();
    robin_hood::unordered_map<string, char2double> pMap = propMap.createTransitionDict(freqDict);
    results = list<tuple<string, vector<unsigned char>>>();
    FreqTable freqs = FreqTable(motif, "", 0, false, codewordLen, pMap);
    freqs.calcFreqs();
    if (encode) {
        if (static_cast<string>(config["encode"]["input"]).ends_with(".zip")) {
            encode_zip(config, freqs, config["encode"]["min_length"], config["encode"]["same_length"], configPath);
        } else {
            ifstream inStream(config["encode"]["input"], ios::binary);
            assert(inStream.good());
            BitInStream bin(inStream, config["general"]["sync"]);
            ofstream out(config["encode"]["output"], ios::binary);
            inflating(freqs, bin, out, config["encode"]["min_length"]);
            if(config["encode"]["update_config"]){
                out.flush();
                out.close();
                ifstream outin(config["encode"]["output"]);
                stringstream buffer;
                buffer << outin.rdbuf();
                string inp = buffer.str();
                int size = inp.size();
                config[nlohmann::json::json_pointer("/decode/length")] = size;
                std::ofstream confout(configPath);
                confout << config;
            }
        }
    } else {
        robin_hood::unordered_map<string, char2double> tMap = ProbMap(codewordLen, true, codewords,
                                                                motif).createTransitionDict(freqDict);
        if (static_cast<string>(config["decode"]["input"]).ends_with(".zip")) {
            Zippy::ZipArchive inarch(static_cast<string>(config["decode"]["input"]));
            std::vector<std::string> ents = inarch.GetEntryNames();
            absl::synchronization_internal::ThreadPool pool(config["general"]["threads"]);
            std::vector<std::string> inpts;
            for (auto &ent: ents) {
                inpts.push_back(inarch.GetEntry(ent).GetDataAsString());
            }
            for (auto &inp: inpts) {
                pool.Schedule(std::bind(do_decode, std::ref(inp), std::ref(freqs), std::ref(tMap), std::ref(motif), std::ref(config), std::ref(codewordLen), std::ref(results), std::ref(res_lock)));
            }
            while (results.size() != ents.size()) {
                this_thread::sleep_for(chrono::milliseconds(500));
            }
            {
                std::unique_lock<std::mutex> uLock(*res_lock);
                write_to_zip(config["decode"]["output"], true, static_cast<bool>(config["general"]["zip"]["most_common_only"]), static_cast<bool>(config["general"]["zip"]["decodable_only"]),results);
            }
        } else if (config["general"]["as_fasta"]) {
            // since we are returning a set, we wont have duplicates
            robin_hood::unordered_set<string> dna_lines = parseFasta(config["decode"]["input"]);
            absl::synchronization_internal::ThreadPool pool(config["general"]["threads"]);
            for (const string &line: dna_lines) {
                pool.Schedule(std::bind(do_decode, std::ref(line), std::ref(freqs), std::ref(tMap), std::ref(motif), std::ref(config), std::ref(codewordLen), std::ref(results), std::ref(res_lock)));
            }
            //TODO THIS CONDITION SHOULD BE IMPROVED (right now we can not make "results" a set and thus might have duplicates)
            // ideally we would not want any (semi) busy waiting and instead be notified when the threadpool is done
            while (results.size() < dna_lines.size()) {
                this_thread::sleep_for(chrono::milliseconds(1000));
            }
            {
                std::unique_lock<std::mutex> uLock(*res_lock);
                write_to_zip(config["decode"]["output"], true, static_cast<bool>(config["general"]["zip"]["most_common_only"]), static_cast<bool>(config["general"]["zip"]["decodable_only"]),results);
            }
        } else {
            ifstream iStream(config["decode"]["input"]);
            stringstream buffer;
            buffer << iStream.rdbuf();
            string inp = buffer.str();
            thread_local ECdecoding ecDec = ECdecoding(inp, freqs, tMap, true, config);

            SeqEntry dec = ecDec.decode(codewordLen, motif, config);
            ofstream out(config["decode"]["output"], ios::out | ios::binary);
            const vector<unsigned char> str = *dec.ac.bitout.get_data();
            std::string seq(reinterpret_cast<const char *>(str.data()), str.size());
            out << seq;
            out.flush();
            out.close();
        }
    }
}